

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> ConnectDirectly(CService *dest,bool manual_connection)

{
  long lVar1;
  socklen_t len_00;
  undefined1 sock [8];
  bool bVar2;
  sa_family_t sVar3;
  bool in_DL;
  undefined7 in_register_00000031;
  CService *this;
  sockaddr_storage *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  socklen_t len;
  undefined1 local_d8 [8];
  undefined1 local_d0 [32];
  sockaddr_storage sockaddr;
  
  this = (CService *)CONCAT71(in_register_00000031,manual_connection);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = CService::GetSAFamily(this);
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)local_d8
             ,0x1172820,(uint)sVar3,1);
  if (local_d8 == (undefined1  [8])0x0) {
    bVar2 = LogAcceptCategory(NET,Error);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&sockaddr,this);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file._M_len = 0x54;
      logging_function._M_str = "ConnectDirectly";
      logging_function._M_len = 0xf;
      LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x274,NET,Error,
                 "Cannot create a socket for connecting to %s\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sockaddr);
      this_00 = &sockaddr;
      goto LAB_00a9c1cb;
    }
  }
  else {
    len = 0x80;
    bVar2 = CService::GetSockAddr(this,(sockaddr *)&sockaddr,&len);
    sock = local_d8;
    len_00 = len;
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)local_d0,this);
      bVar2 = ConnectToSocket((Sock *)sock,(sockaddr *)&sockaddr,len_00,(string *)local_d0,in_DL);
      std::__cxx11::string::~string((string *)local_d0);
      if (bVar2) {
        (dest->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)local_d8;
        local_d8 = (undefined1  [8])0x0;
        goto LAB_00a9c1d4;
      }
    }
    else {
      CService::ToStringAddrPort_abi_cxx11_((string *)local_d0,this);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file_00._M_len = 0x54;
      logging_function_00._M_str = "ConnectDirectly";
      logging_function_00._M_len = 0xf;
      LogPrintf_<std::__cxx11::string>
                (logging_function_00,source_file_00,0x27c,ALL,Info,
                 "Cannot get sockaddr for %s: unsupported network\n",(string *)local_d0);
      this_00 = (sockaddr_storage *)local_d0;
LAB_00a9c1cb:
      std::__cxx11::string::~string((string *)this_00);
    }
  }
  (dest->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)0x0;
LAB_00a9c1d4:
  if (local_d8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_d8 + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)dest;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> ConnectDirectly(const CService& dest, bool manual_connection)
{
    auto sock = CreateSock(dest.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "Cannot create a socket for connecting to %s\n", dest.ToStringAddrPort());
        return {};
    }

    // Create a sockaddr from the specified service.
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!dest.GetSockAddr((struct sockaddr*)&sockaddr, &len)) {
        LogPrintf("Cannot get sockaddr for %s: unsupported network\n", dest.ToStringAddrPort());
        return {};
    }

    if (!ConnectToSocket(*sock, (struct sockaddr*)&sockaddr, len, dest.ToStringAddrPort(), manual_connection)) {
        return {};
    }

    return sock;
}